

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
          (AssertionResult *__return_storage_ptr__,internal *this,char *lhs_expression,
          char *rhs_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char (*rhs) [9])

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare(rhs_expression);
  if (iVar1 == 0) {
    testing::AssertionSuccess();
  }
  else {
    CmpHelperEQFailure<std::__cxx11::string,char[9]>
              (__return_storage_ptr__,this,lhs_expression,rhs_expression,lhs,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}